

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O0

ostream * operator<<(ostream *out,Vector *w)

{
  ostream *poVar1;
  double *in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RSI);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[1]);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI[2]);
  std::operator<<(poVar1,"]");
  return in_RDI;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Vector& w) {
      out << "[" << w.x << ", " << w.y << ", " << w.z << "]";
      return out;
   }